

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_SENSE_GOLD(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  char *fmt;
  
  _Var1 = sense_stuff((effect_handler_context_t_conflict *)(ulong)(uint)context->y,
                      (_func__Bool_object_ptr *)(ulong)(uint)context->x,(object_kind *)tval_is_money
                     );
  if (_Var1) {
    fmt = "You sense the presence of gold!";
  }
  else {
    if (context->aware != true) goto LAB_0013ee54;
    fmt = "You sense no gold.";
  }
  msg(fmt);
LAB_0013ee54:
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_SENSE_GOLD(effect_handler_context_t *context)
{
	bool money = sense_stuff(context, tval_is_money, unknown_gold_kind);

	if (money) {
		msg("You sense the presence of gold!");
	} else if (context->aware) {
		msg("You sense no gold.");
	}

	context->ident = true;
	return true;
}